

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCopyMemoryMemoryAccess
          (ValidationState_t *_,Instruction *inst)

{
  uint uVar1;
  Op OVar2;
  int iVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar4;
  size_type sVar5;
  Feature *pFVar6;
  DiagnosticStream *pDVar7;
  bool bVar8;
  char *local_5d0;
  DiagnosticStream local_5c8;
  DiagnosticStream local_3f0;
  uint local_214;
  undefined1 local_210 [4];
  uint second_access;
  spv_result_t local_34;
  uint local_30;
  spv_result_t error_1;
  uint32_t second_access_index;
  uint first_access;
  spv_result_t error;
  uint32_t first_access_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _error = (Instruction *)inst;
  inst_local = (Instruction *)_;
  OVar2 = val::Instruction::opcode((Instruction *)inst);
  bVar8 = true;
  if (OVar2 != OpCopyMemory) {
    OVar2 = val::Instruction::opcode(_error);
    bVar8 = OVar2 == OpCopyMemorySized;
  }
  if (!bVar8) {
    __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp"
                  ,0x48c,
                  "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                 );
  }
  OVar2 = val::Instruction::opcode(_error);
  first_access = 3;
  if (OVar2 == OpCopyMemory) {
    first_access = 2;
  }
  pvVar4 = val::Instruction::operands(_error);
  sVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar4);
  if (first_access < sVar5) {
    second_access_index =
         CheckMemoryAccess((ValidationState_t *)inst_local,(Instruction *)_error,first_access);
    if (second_access_index != SPV_SUCCESS) {
      return second_access_index;
    }
    error_1 = val::Instruction::GetOperandAs<unsigned_int>(_error,(ulong)first_access);
    uVar1 = first_access;
    iVar3 = MemoryAccessNumWords(error_1);
    local_30 = uVar1 + iVar3;
    pvVar4 = val::Instruction::operands(_error);
    sVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar4);
    if (local_30 < sVar5) {
      pFVar6 = ValidationState_t::features((ValidationState_t *)inst_local);
      if ((pFVar6->copy_memory_permits_two_memory_accesses & 1U) == 0) {
        ValidationState_t::diag
                  (&local_5c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_error);
        OVar2 = val::Instruction::opcode(_error);
        local_5d0 = spvOpcodeString(OVar2);
        pDVar7 = DiagnosticStream::operator<<(&local_5c8,&local_5d0);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [62])
                                   " with two memory access operands requires SPIR-V 1.4 or later");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream(&local_5c8);
        return __local._4_4_;
      }
      local_34 = CheckMemoryAccess((ValidationState_t *)inst_local,(Instruction *)_error,local_30);
      if (local_34 != SPV_SUCCESS) {
        return local_34;
      }
      if ((error_1 & 0x10) != SPV_SUCCESS) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_210,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_error);
        pDVar7 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_210,
                            (char (*) [60])
                            "Target memory access must not include MakePointerVisibleKHR");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_210);
        return __local._4_4_;
      }
      local_214 = val::Instruction::GetOperandAs<unsigned_int>(_error,(ulong)local_30);
      if ((local_214 & 8) != 0) {
        ValidationState_t::diag
                  (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_error);
        pDVar7 = DiagnosticStream::operator<<
                           (&local_3f0,
                            (char (*) [62])
                            "Source memory access must not include MakePointerAvailableKHR");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream(&local_3f0);
        return __local._4_4_;
      }
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateCopyMemoryMemoryAccess(ValidationState_t& _,
                                            const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCopyMemory ||
         inst->opcode() == spv::Op::OpCopyMemorySized);
  const uint32_t first_access_index =
      inst->opcode() == spv::Op::OpCopyMemory ? 2 : 3;
  if (inst->operands().size() > first_access_index) {
    if (auto error = CheckMemoryAccess(_, inst, first_access_index))
      return error;

    const auto first_access = inst->GetOperandAs<uint32_t>(first_access_index);
    const uint32_t second_access_index =
        first_access_index + MemoryAccessNumWords(first_access);
    if (inst->operands().size() > second_access_index) {
      if (_.features().copy_memory_permits_two_memory_accesses) {
        if (auto error = CheckMemoryAccess(_, inst, second_access_index))
          return error;

        // In the two-access form in SPIR-V 1.4 and later:
        //  - the first is the target (write) access and it can't have
        //  make-visible.
        //  - the second is the source (read) access and it can't have
        //  make-available.
        if (first_access &
            uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Target memory access must not include "
                    "MakePointerVisibleKHR";
        }
        const auto second_access =
            inst->GetOperandAs<uint32_t>(second_access_index);
        if (second_access &
            uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Source memory access must not include "
                    "MakePointerAvailableKHR";
        }
      } else {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(static_cast<spv::Op>(inst->opcode()))
               << " with two memory access operands requires SPIR-V 1.4 or "
                  "later";
      }
    }
  }
  return SPV_SUCCESS;
}